

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RPLIDAR.h
# Opt level: O2

int GetAllSupportedScanModesRPLIDAR(RPLIDAR *pRPLIDAR,RPLIDARSCANMODE *pScanModes)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  char *__s;
  uint local_80;
  uint local_7c;
  uchar databuf [68];
  
  databuf[0] = '\0';
  databuf[1] = '\0';
  databuf[2] = '\0';
  databuf[3] = '\0';
  databuf[4] = '\0';
  databuf[5] = '\0';
  databuf[6] = '\0';
  databuf[7] = '\0';
  databuf[8] = '\0';
  databuf[9] = '\0';
  databuf[10] = '\0';
  databuf[0xb] = '\0';
  databuf[0xc] = '\0';
  databuf[0xd] = '\0';
  databuf[0xe] = '\0';
  databuf[0xf] = '\0';
  databuf[0x10] = '\0';
  databuf[0x11] = '\0';
  databuf[0x12] = '\0';
  databuf[0x13] = '\0';
  databuf[0x14] = '\0';
  databuf[0x15] = '\0';
  databuf[0x16] = '\0';
  databuf[0x17] = '\0';
  databuf[0x18] = '\0';
  databuf[0x19] = '\0';
  databuf[0x1a] = '\0';
  databuf[0x1b] = '\0';
  databuf[0x1c] = '\0';
  databuf[0x1d] = '\0';
  databuf[0x1e] = '\0';
  databuf[0x1f] = '\0';
  databuf[0x20] = '\0';
  databuf[0x21] = '\0';
  databuf[0x22] = '\0';
  databuf[0x23] = '\0';
  databuf[0x24] = '\0';
  databuf[0x25] = '\0';
  databuf[0x26] = '\0';
  databuf[0x27] = '\0';
  databuf[0x28] = '\0';
  databuf[0x29] = '\0';
  databuf[0x2a] = '\0';
  databuf[0x2b] = '\0';
  databuf[0x2c] = '\0';
  databuf[0x2d] = '\0';
  databuf[0x2e] = '\0';
  databuf[0x2f] = '\0';
  databuf[0x30] = '\0';
  databuf[0x31] = '\0';
  databuf[0x32] = '\0';
  databuf[0x33] = '\0';
  databuf[0x34] = '\0';
  databuf[0x35] = '\0';
  databuf[0x36] = '\0';
  databuf[0x37] = '\0';
  databuf[0x38] = '\0';
  databuf[0x39] = '\0';
  databuf[0x3a] = '\0';
  databuf[0x3b] = '\0';
  databuf[0x3c] = '\0';
  databuf[0x3d] = '\0';
  databuf[0x3e] = '\0';
  databuf[0x3f] = '\0';
  databuf[0x40] = '\0';
  databuf[0x41] = '\0';
  databuf[0x42] = '\0';
  databuf[0x43] = '\0';
  iVar1 = GetConfRPLIDAR(pRPLIDAR,0x70,(uchar *)0x0,0,databuf,6);
  if (iVar1 == 0) {
    __s = "A RPLIDAR is not responding correctly : Bad response payload type. ";
    if (databuf[0] == 'p') {
      if (CONCAT11(databuf[5],databuf[4]) == 0) {
        __s = "A RPLIDAR is not responding correctly. ";
      }
      else {
        uVar3 = (uint)CONCAT11(databuf[5],databuf[4]);
        if (0x10 < uVar3) {
          puts("Warning : RPLIDAR unsupported scanmodes. ");
        }
        memset(pScanModes,0,0x600);
        local_7c = 0x10;
        if (uVar3 < 0x10) {
          local_7c = uVar3;
        }
        local_80 = 0;
        while( true ) {
          if (local_7c <= local_80) {
            return 0;
          }
          pScanModes[local_80].id = local_80;
          databuf[0x30] = '\0';
          databuf[0x31] = '\0';
          databuf[0x32] = '\0';
          databuf[0x33] = '\0';
          databuf[0x34] = '\0';
          databuf[0x35] = '\0';
          databuf[0x36] = '\0';
          databuf[0x37] = '\0';
          databuf[0x38] = '\0';
          databuf[0x39] = '\0';
          databuf[0x3a] = '\0';
          databuf[0x3b] = '\0';
          databuf[0x3c] = '\0';
          databuf[0x3d] = '\0';
          databuf[0x3e] = '\0';
          databuf[0x3f] = '\0';
          databuf[0x20] = '\0';
          databuf[0x21] = '\0';
          databuf[0x22] = '\0';
          databuf[0x23] = '\0';
          databuf[0x24] = '\0';
          databuf[0x25] = '\0';
          databuf[0x26] = '\0';
          databuf[0x27] = '\0';
          databuf[0x28] = '\0';
          databuf[0x29] = '\0';
          databuf[0x2a] = '\0';
          databuf[0x2b] = '\0';
          databuf[0x2c] = '\0';
          databuf[0x2d] = '\0';
          databuf[0x2e] = '\0';
          databuf[0x2f] = '\0';
          databuf[0x10] = '\0';
          databuf[0x11] = '\0';
          databuf[0x12] = '\0';
          databuf[0x13] = '\0';
          databuf[0x14] = '\0';
          databuf[0x15] = '\0';
          databuf[0x16] = '\0';
          databuf[0x17] = '\0';
          databuf[0x18] = '\0';
          databuf[0x19] = '\0';
          databuf[0x1a] = '\0';
          databuf[0x1b] = '\0';
          databuf[0x1c] = '\0';
          databuf[0x1d] = '\0';
          databuf[0x1e] = '\0';
          databuf[0x1f] = '\0';
          databuf[0] = '\0';
          databuf[1] = '\0';
          databuf[2] = '\0';
          databuf[3] = '\0';
          databuf[4] = '\0';
          databuf[5] = '\0';
          databuf[6] = '\0';
          databuf[7] = '\0';
          databuf[8] = '\0';
          databuf[9] = '\0';
          databuf[10] = '\0';
          databuf[0xb] = '\0';
          databuf[0xc] = '\0';
          databuf[0xd] = '\0';
          databuf[0xe] = '\0';
          databuf[0xf] = '\0';
          databuf[0x40] = '\0';
          databuf[0x41] = '\0';
          databuf[0x42] = '\0';
          databuf[0x43] = '\0';
          iVar1 = GetConfRPLIDAR(pRPLIDAR,0x71,(uchar *)&local_80,2,databuf,8);
          if (iVar1 != 0) {
            return 1;
          }
          if (databuf[0] != 'q') break;
          pScanModes[local_80].us_per_sample =
               (double)(CONCAT22(databuf._6_2_,CONCAT11(databuf[5],databuf[4])) >> 8);
          databuf[0x30] = '\0';
          databuf[0x31] = '\0';
          databuf[0x32] = '\0';
          databuf[0x33] = '\0';
          databuf[0x34] = '\0';
          databuf[0x35] = '\0';
          databuf[0x36] = '\0';
          databuf[0x37] = '\0';
          databuf[0x38] = '\0';
          databuf[0x39] = '\0';
          databuf[0x3a] = '\0';
          databuf[0x3b] = '\0';
          databuf[0x3c] = '\0';
          databuf[0x3d] = '\0';
          databuf[0x3e] = '\0';
          databuf[0x3f] = '\0';
          databuf[0x20] = '\0';
          databuf[0x21] = '\0';
          databuf[0x22] = '\0';
          databuf[0x23] = '\0';
          databuf[0x24] = '\0';
          databuf[0x25] = '\0';
          databuf[0x26] = '\0';
          databuf[0x27] = '\0';
          databuf[0x28] = '\0';
          databuf[0x29] = '\0';
          databuf[0x2a] = '\0';
          databuf[0x2b] = '\0';
          databuf[0x2c] = '\0';
          databuf[0x2d] = '\0';
          databuf[0x2e] = '\0';
          databuf[0x2f] = '\0';
          databuf[0x10] = '\0';
          databuf[0x11] = '\0';
          databuf[0x12] = '\0';
          databuf[0x13] = '\0';
          databuf[0x14] = '\0';
          databuf[0x15] = '\0';
          databuf[0x16] = '\0';
          databuf[0x17] = '\0';
          databuf[0x18] = '\0';
          databuf[0x19] = '\0';
          databuf[0x1a] = '\0';
          databuf[0x1b] = '\0';
          databuf[0x1c] = '\0';
          databuf[0x1d] = '\0';
          databuf[0x1e] = '\0';
          databuf[0x1f] = '\0';
          databuf[0] = '\0';
          databuf[1] = '\0';
          databuf[2] = '\0';
          databuf[3] = '\0';
          databuf[4] = '\0';
          databuf[5] = '\0';
          databuf[6] = '\0';
          databuf[7] = '\0';
          databuf[8] = '\0';
          databuf[9] = '\0';
          databuf[10] = '\0';
          databuf[0xb] = '\0';
          databuf[0xc] = '\0';
          databuf[0xd] = '\0';
          databuf[0xe] = '\0';
          databuf[0xf] = '\0';
          databuf[0x40] = '\0';
          databuf[0x41] = '\0';
          databuf[0x42] = '\0';
          databuf[0x43] = '\0';
          iVar1 = GetConfRPLIDAR(pRPLIDAR,0x74,(uchar *)&local_80,2,databuf,8);
          if (iVar1 != 0) {
            return 1;
          }
          if (databuf[0] != 't') break;
          pScanModes[local_80].max_distance =
               (double)(CONCAT22(databuf._6_2_,CONCAT11(databuf[5],databuf[4])) >> 8);
          databuf[0x30] = '\0';
          databuf[0x31] = '\0';
          databuf[0x32] = '\0';
          databuf[0x33] = '\0';
          databuf[0x34] = '\0';
          databuf[0x35] = '\0';
          databuf[0x36] = '\0';
          databuf[0x37] = '\0';
          databuf[0x38] = '\0';
          databuf[0x39] = '\0';
          databuf[0x3a] = '\0';
          databuf[0x3b] = '\0';
          databuf[0x3c] = '\0';
          databuf[0x3d] = '\0';
          databuf[0x3e] = '\0';
          databuf[0x3f] = '\0';
          databuf[0x20] = '\0';
          databuf[0x21] = '\0';
          databuf[0x22] = '\0';
          databuf[0x23] = '\0';
          databuf[0x24] = '\0';
          databuf[0x25] = '\0';
          databuf[0x26] = '\0';
          databuf[0x27] = '\0';
          databuf[0x28] = '\0';
          databuf[0x29] = '\0';
          databuf[0x2a] = '\0';
          databuf[0x2b] = '\0';
          databuf[0x2c] = '\0';
          databuf[0x2d] = '\0';
          databuf[0x2e] = '\0';
          databuf[0x2f] = '\0';
          databuf[0x10] = '\0';
          databuf[0x11] = '\0';
          databuf[0x12] = '\0';
          databuf[0x13] = '\0';
          databuf[0x14] = '\0';
          databuf[0x15] = '\0';
          databuf[0x16] = '\0';
          databuf[0x17] = '\0';
          databuf[0x18] = '\0';
          databuf[0x19] = '\0';
          databuf[0x1a] = '\0';
          databuf[0x1b] = '\0';
          databuf[0x1c] = '\0';
          databuf[0x1d] = '\0';
          databuf[0x1e] = '\0';
          databuf[0x1f] = '\0';
          databuf[0] = '\0';
          databuf[1] = '\0';
          databuf[2] = '\0';
          databuf[3] = '\0';
          databuf[4] = '\0';
          databuf[5] = '\0';
          databuf[6] = '\0';
          databuf[7] = '\0';
          databuf[8] = '\0';
          databuf[9] = '\0';
          databuf[10] = '\0';
          databuf[0xb] = '\0';
          databuf[0xc] = '\0';
          databuf[0xd] = '\0';
          databuf[0xe] = '\0';
          databuf[0xf] = '\0';
          databuf[0x40] = '\0';
          databuf[0x41] = '\0';
          databuf[0x42] = '\0';
          databuf[0x43] = '\0';
          iVar1 = GetConfRPLIDAR(pRPLIDAR,0x75,(uchar *)&local_80,2,databuf,5);
          if (iVar1 != 0) {
            return 1;
          }
          if (databuf[0] != 'u') break;
          pScanModes[local_80].ans_type = (uint)databuf[4];
          databuf[0x30] = '\0';
          databuf[0x31] = '\0';
          databuf[0x32] = '\0';
          databuf[0x33] = '\0';
          databuf[0x34] = '\0';
          databuf[0x35] = '\0';
          databuf[0x36] = '\0';
          databuf[0x37] = '\0';
          databuf[0x38] = '\0';
          databuf[0x39] = '\0';
          databuf[0x3a] = '\0';
          databuf[0x3b] = '\0';
          databuf[0x3c] = '\0';
          databuf[0x3d] = '\0';
          databuf[0x3e] = '\0';
          databuf[0x3f] = '\0';
          databuf[0x20] = '\0';
          databuf[0x21] = '\0';
          databuf[0x22] = '\0';
          databuf[0x23] = '\0';
          databuf[0x24] = '\0';
          databuf[0x25] = '\0';
          databuf[0x26] = '\0';
          databuf[0x27] = '\0';
          databuf[0x28] = '\0';
          databuf[0x29] = '\0';
          databuf[0x2a] = '\0';
          databuf[0x2b] = '\0';
          databuf[0x2c] = '\0';
          databuf[0x2d] = '\0';
          databuf[0x2e] = '\0';
          databuf[0x2f] = '\0';
          databuf[0x10] = '\0';
          databuf[0x11] = '\0';
          databuf[0x12] = '\0';
          databuf[0x13] = '\0';
          databuf[0x14] = '\0';
          databuf[0x15] = '\0';
          databuf[0x16] = '\0';
          databuf[0x17] = '\0';
          databuf[0x18] = '\0';
          databuf[0x19] = '\0';
          databuf[0x1a] = '\0';
          databuf[0x1b] = '\0';
          databuf[0x1c] = '\0';
          databuf[0x1d] = '\0';
          databuf[0x1e] = '\0';
          databuf[0x1f] = '\0';
          databuf[0] = '\0';
          databuf[1] = '\0';
          databuf[2] = '\0';
          databuf[3] = '\0';
          databuf[4] = '\0';
          databuf[5] = '\0';
          databuf[6] = '\0';
          databuf[7] = '\0';
          databuf[8] = '\0';
          databuf[9] = '\0';
          databuf[10] = '\0';
          databuf[0xb] = '\0';
          databuf[0xc] = '\0';
          databuf[0xd] = '\0';
          databuf[0xe] = '\0';
          databuf[0xf] = '\0';
          databuf[0x40] = '\0';
          databuf[0x41] = '\0';
          databuf[0x42] = '\0';
          databuf[0x43] = '\0';
          iVar1 = GetConfRPLIDAR(pRPLIDAR,0x7f,(uchar *)&local_80,2,databuf,0x40);
          if (iVar1 != 0) {
            return 1;
          }
          if (databuf[0] != '\x7f') break;
          uVar2 = (ulong)local_80;
          *(ulong *)(pScanModes[uVar2].scan_mode + 0x30) = CONCAT44(databuf._56_4_,databuf._52_4_);
          *(ulong *)(pScanModes[uVar2].scan_mode + 0x30 + 8) =
               CONCAT44(databuf._64_4_,databuf._60_4_);
          *(ulong *)(pScanModes[uVar2].scan_mode + 0x20) = CONCAT44(databuf._40_4_,databuf._36_4_);
          *(ulong *)(pScanModes[uVar2].scan_mode + 0x20 + 8) =
               CONCAT44(databuf._48_4_,databuf._44_4_);
          *(ulong *)(pScanModes[uVar2].scan_mode + 0x10) = CONCAT44(databuf._24_4_,databuf._20_4_);
          *(ulong *)(pScanModes[uVar2].scan_mode + 0x10 + 8) =
               CONCAT44(databuf._32_4_,databuf._28_4_);
          *(ulong *)pScanModes[uVar2].scan_mode =
               CONCAT44(databuf._8_4_,CONCAT22(databuf._6_2_,CONCAT11(databuf[5],databuf[4])));
          *(ulong *)(pScanModes[uVar2].scan_mode + 8) = CONCAT44(databuf._16_4_,databuf._12_4_);
          local_80 = local_80 + 1;
        }
        __s = "A RPLIDAR is not responding correctly : Bad response payload type. ";
      }
    }
    puts(__s);
  }
  return 1;
}

Assistant:

inline int GetAllSupportedScanModesRPLIDAR(RPLIDAR* pRPLIDAR, RPLIDARSCANMODE* pScanModes)
{
#ifdef ENABLE_RPLIDAR_SDK_SUPPORT
#ifdef FORCE_RPLIDAR_SDK_V1
	std::vector<RplidarScanMode> outModes;
#else
	std::vector<LidarScanMode> outModes;
#endif // FORCE_RPLIDAR_SDK_V1
	unsigned int i = 0;

	if (SL_IS_FAIL(pRPLIDAR->drv->getAllSupportedScanModes(outModes)))
	{
		printf("A RPLIDAR is not responding correctly : getAllSupportedScanModes() failed. \n");
		return EXIT_FAILURE;
	}
	if (outModes.size() > MAX_NB_SCAN_MODES_RPLIDAR) printf("Warning : RPLIDAR unsupported scanmodes. \n");
	memset(pScanModes, 0, sizeof(RPLIDARSCANMODE)*MAX_NB_SCAN_MODES_RPLIDAR);
	for (i = 0; i < min(outModes.size(), (unsigned int)MAX_NB_SCAN_MODES_RPLIDAR); i++)
	{
		pScanModes[i].id = (int)outModes[i].id;
		pScanModes[i].us_per_sample = (double)outModes[i].us_per_sample;
		pScanModes[i].max_distance = (double)outModes[i].max_distance;
		pScanModes[i].ans_type = (int)outModes[i].ans_type;
		memcpy(pScanModes[i].scan_mode, outModes[i].scan_mode, sizeof(pScanModes[i].scan_mode));
	}
	return EXIT_SUCCESS;
#else
	unsigned char databuf[68];
	unsigned short scanmodecount = 0;
	unsigned int i = 0, uspersample = 0, maxdistance = 0;

	memset(databuf, 0, sizeof(databuf));
	if (GetConfRPLIDAR(pRPLIDAR, LIDAR_CONF_SCAN_MODE_COUNT_RPLIDAR, NULL, 0, databuf, 6) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if (databuf[0] != (unsigned char)LIDAR_CONF_SCAN_MODE_COUNT_RPLIDAR)
	{
		printf("A RPLIDAR is not responding correctly : Bad response payload type. \n");
		return EXIT_FAILURE;
	}
	scanmodecount = (unsigned short)((databuf[5]<<8)|databuf[4]);
	if (scanmodecount <= 0)
	{
		printf("A RPLIDAR is not responding correctly. \n");
		return EXIT_FAILURE;
	}
	if (scanmodecount > MAX_NB_SCAN_MODES_RPLIDAR) printf("Warning : RPLIDAR unsupported scanmodes. \n");

	memset(pScanModes, 0, sizeof(RPLIDARSCANMODE)*MAX_NB_SCAN_MODES_RPLIDAR);
	for (i = 0; i < min(scanmodecount, (unsigned int)MAX_NB_SCAN_MODES_RPLIDAR); i++)
	{
		pScanModes[i].id = (int)i;
		memset(databuf, 0, sizeof(databuf));
		if (GetConfRPLIDAR(pRPLIDAR, LIDAR_CONF_SCAN_MODE_US_PER_SAMPLE_RPLIDAR, (unsigned char*)&i, 2, databuf, 8) != EXIT_SUCCESS)
		{
			return EXIT_FAILURE;
		}
		if (databuf[0] != (unsigned char)LIDAR_CONF_SCAN_MODE_US_PER_SAMPLE_RPLIDAR)
		{
			printf("A RPLIDAR is not responding correctly : Bad response payload type. \n");
			return EXIT_FAILURE;
		}
		memcpy((unsigned char*)&uspersample, databuf+4, 4);
		pScanModes[i].us_per_sample = (double)(uspersample/(1<<8));

		memset(databuf, 0, sizeof(databuf));
		if (GetConfRPLIDAR(pRPLIDAR, LIDAR_CONF_SCAN_MODE_MAX_DISTANCE_RPLIDAR, (unsigned char*)&i, 2, databuf, 8) != EXIT_SUCCESS)
		{
			return EXIT_FAILURE;
		}
		if (databuf[0] != (unsigned char)LIDAR_CONF_SCAN_MODE_MAX_DISTANCE_RPLIDAR)
		{
			printf("A RPLIDAR is not responding correctly : Bad response payload type. \n");
			return EXIT_FAILURE;
		}
		memcpy((unsigned char*)&maxdistance, databuf+4, 4);
		pScanModes[i].max_distance = (double)(maxdistance/(1<<8));

		memset(databuf, 0, sizeof(databuf));
		if (GetConfRPLIDAR(pRPLIDAR, LIDAR_CONF_SCAN_MODE_ANS_TYPE_RPLIDAR, (unsigned char*)&i, 2, databuf, 5) != EXIT_SUCCESS)
		{
			return EXIT_FAILURE;
		}
		if (databuf[0] != (unsigned char)LIDAR_CONF_SCAN_MODE_ANS_TYPE_RPLIDAR)
		{
			printf("A RPLIDAR is not responding correctly : Bad response payload type. \n");
			return EXIT_FAILURE;
		}
		pScanModes[i].ans_type = (int)databuf[4];

		memset(databuf, 0, sizeof(databuf));
		if (GetConfRPLIDAR(pRPLIDAR, LIDAR_CONF_SCAN_MODE_NAME_RPLIDAR, (unsigned char*)&i, 2, databuf, 64) != EXIT_SUCCESS)
		{
			return EXIT_FAILURE;
		}
		if (databuf[0] != (unsigned char)LIDAR_CONF_SCAN_MODE_NAME_RPLIDAR)
		{
			printf("A RPLIDAR is not responding correctly : Bad response payload type. \n");
			return EXIT_FAILURE;
		}
		memset(pScanModes[i].scan_mode, 0, sizeof(pScanModes[i].scan_mode));
		memcpy(pScanModes[i].scan_mode, databuf+4, sizeof(pScanModes[i].scan_mode));
	}
	return EXIT_SUCCESS;
#endif // ENABLE_RPLIDAR_SDK_SUPPORT
}